

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

ssh_ttymodes * get_ttymodes_from_conf(ssh_ttymodes *__return_storage_ptr__,Seat *seat,Conf *conf)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *ptr;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  char *next;
  uint ispeed;
  char *local_50;
  Conf *local_48;
  Seat *local_40;
  uint local_34;
  
  local_48 = conf;
  local_40 = seat;
  memset(__return_storage_ptr__,0,0x50c);
  lVar5 = 0xc;
  do {
    pcVar4 = *(char **)((long)&zombiechan_channelvt.change_window_size + lVar5 + 4);
    pcVar3 = conf_get_str_str(local_48,0x37,pcVar4);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "N";
    }
    if (*pcVar3 == 'A') {
      ptr = (*local_40->vt->get_ttymode)(local_40,pcVar4);
      pcVar4 = ptr;
      if (ptr != (char *)0x0) goto LAB_0011c453;
      ptr = (char *)0x0;
LAB_0011c571:
      safefree(ptr);
    }
    else if (*pcVar3 == 'V') {
      ptr = (char *)0x0;
      pcVar4 = pcVar3 + 1;
LAB_0011c453:
      iVar2 = *(int *)((long)&get_ttymodes_from_conf::modes_names_types[0].mode + lVar5);
      if (iVar2 == 1) {
        iVar2 = strcasecmp(pcVar4,"yes");
        uVar6 = 1;
        if (iVar2 != 0) {
          iVar2 = strcasecmp(pcVar4,"on");
          if (iVar2 != 0) {
            iVar2 = strcasecmp(pcVar4,"true");
            if (iVar2 != 0) {
              iVar2 = strcasecmp(pcVar4,"+");
              if (iVar2 != 0) {
                iVar2 = strcasecmp(pcVar4,"no");
                uVar6 = 0;
                if (iVar2 != 0) {
                  iVar2 = strcasecmp(pcVar4,"off");
                  if (iVar2 != 0) {
                    iVar2 = strcasecmp(pcVar4,"false");
                    if (iVar2 != 0) {
                      iVar2 = strcasecmp(pcVar4,"-");
                      if (iVar2 != 0) {
                        iVar2 = atoi(pcVar4);
                        uVar6 = (uint)(iVar2 != 0);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        if (iVar2 != 0) {
          __assert_fail("false && \"Bad mode->type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c"
                        ,0x1de,"struct ssh_ttymodes get_ttymodes_from_conf(Seat *, Conf *)");
        }
        if (*pcVar4 == '\0') {
          uVar6 = 0xff;
        }
        else {
          local_50 = (char *)0x0;
          cVar1 = ctrlparse(pcVar4,&local_50);
          if (local_50 == (char *)0x0) {
            cVar1 = *pcVar4;
          }
          uVar6 = (uint)cVar1;
        }
      }
      iVar2 = *(int *)((long)&zombiechan_channelvt.request_response + lVar5 + 4);
      __return_storage_ptr__->have_mode[iVar2] = true;
      __return_storage_ptr__->mode_val[iVar2] = uVar6;
      goto LAB_0011c571;
    }
    lVar5 = lVar5 + 0x10;
    if (lVar5 == 0x36c) {
      local_34 = 0x9600;
      local_50 = (char *)CONCAT44(local_50._4_4_,0x9600);
      pcVar4 = conf_get_str(local_48,0x36);
      __isoc99_sscanf(pcVar4,"%u,%u",&local_50,&local_34);
      __return_storage_ptr__->have_mode[0x100] = true;
      __return_storage_ptr__->mode_val[0x100] = local_34;
      __return_storage_ptr__->have_mode[0x101] = true;
      __return_storage_ptr__->mode_val[0x101] = (uint)local_50;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

struct ssh_ttymodes get_ttymodes_from_conf(Seat *seat, Conf *conf)
{
    struct ssh_ttymodes modes;
    size_t i;

    static const struct mode_name_type {
        const char *mode;
        int opcode;
        enum { TYPE_CHAR, TYPE_BOOL } type;
    } modes_names_types[] = {
        #define TTYMODE_CHAR(name, val, index) { #name, val, TYPE_CHAR },
        #define TTYMODE_FLAG(name, val, field, mask) { #name, val, TYPE_BOOL },
        #include "ttymode-list.h"
        #undef TTYMODE_CHAR
        #undef TTYMODE_FLAG
    };

    memset(&modes, 0, sizeof(modes));

    for (i = 0; i < lenof(modes_names_types); i++) {
        const struct mode_name_type *mode = &modes_names_types[i];
        const char *sval = conf_get_str_str(conf, CONF_ttymodes, mode->mode);
        char *to_free = NULL;

        if (!sval)
            sval = "N";                /* just in case */

        /*
         * sval[0] can be
         *  - 'V', indicating that an explicit value follows it;
         *  - 'A', indicating that we should pass the value through from
         *    the local environment via get_ttymode; or
         *  - 'N', indicating that we should explicitly not send this
         *    mode.
         */
        if (sval[0] == 'A') {
            sval = to_free = seat_get_ttymode(seat, mode->mode);
        } else if (sval[0] == 'V') {
            sval++;                    /* skip the 'V' */
        } else {
            /* else 'N', or something from the future we don't understand */
            continue;
        }

        if (sval) {
            /*
             * Parse the string representation of the tty mode
             * into the integer value it will take on the wire.
             */
            unsigned ival = 0;

            switch (mode->type) {
              case TYPE_CHAR:
                if (*sval) {
                    char *next = NULL;
                    /* We know ctrlparse won't write to the string, so
                     * casting away const is ugly but allowable. */
                    ival = ctrlparse((char *)sval, &next);
                    if (!next)
                        ival = sval[0];
                } else {
                    ival = 255; /* special value meaning "don't set" */
                }
                break;
              case TYPE_BOOL:
                if (stricmp(sval, "yes") == 0 ||
                    stricmp(sval, "on") == 0 ||
                    stricmp(sval, "true") == 0 ||
                    stricmp(sval, "+") == 0)
                    ival = 1;      /* true */
                else if (stricmp(sval, "no") == 0 ||
                         stricmp(sval, "off") == 0 ||
                         stricmp(sval, "false") == 0 ||
                         stricmp(sval, "-") == 0)
                    ival = 0;      /* false */
                else
                    ival = (atoi(sval) != 0);
                break;
              default:
                unreachable("Bad mode->type");
            }

            modes.have_mode[mode->opcode] = true;
            modes.mode_val[mode->opcode] = ival;
        }

        sfree(to_free);
    }

    {
        unsigned ospeed, ispeed;

        /* Unpick the terminal-speed config string. */
        ospeed = ispeed = 38400;           /* last-resort defaults */
        sscanf(conf_get_str(conf, CONF_termspeed), "%u,%u", &ospeed, &ispeed);
        /* Currently we unconditionally set these */
        modes.have_mode[TTYMODE_ISPEED] = true;
        modes.mode_val[TTYMODE_ISPEED] = ispeed;
        modes.have_mode[TTYMODE_OSPEED] = true;
        modes.mode_val[TTYMODE_OSPEED] = ospeed;
    }

    return modes;
}